

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_helpers.hpp
# Opt level: O3

string_t duckdb::HistogramStringFunctorBase::ExtractValue<duckdb::string_t>
                   (UnifiedVectorFormat *bin_data,idx_t offset,AggregateInputData *aggr_input)

{
  ulong *puVar1;
  sel_t *psVar2;
  ulong uVar3;
  uint *__dest;
  ulong len;
  uint *__src;
  string_t sVar4;
  
  psVar2 = bin_data->sel->sel_vector;
  if (psVar2 != (sel_t *)0x0) {
    offset = (idx_t)psVar2[offset];
  }
  puVar1 = (ulong *)(bin_data->data + offset * 0x10);
  len = (ulong)*(uint *)(bin_data->data + offset * 0x10);
  if (len < 0xd) {
    __dest = (uint *)puVar1[1];
    len = *puVar1 & 0xffffffff;
    uVar3 = *puVar1 >> 0x20;
  }
  else {
    __dest = (uint *)ArenaAllocator::Allocate(aggr_input->allocator,len);
    if ((uint)*puVar1 < 0xd) {
      __src = (uint *)((long)puVar1 + 4);
    }
    else {
      __src = (uint *)puVar1[1];
    }
    switchD_012bc561::default(__dest,__src,len);
    uVar3 = (ulong)*__dest;
  }
  sVar4.value._0_8_ = uVar3 << 0x20 | len;
  sVar4.value.pointer.ptr = (char *)__dest;
  return (string_t)sVar4.value;
}

Assistant:

static T ExtractValue(UnifiedVectorFormat &bin_data, idx_t offset, AggregateInputData &aggr_input) {
		auto &input_str = UnifiedVectorFormat::GetData<T>(bin_data)[bin_data.sel->get_index(offset)];
		if (input_str.IsInlined()) {
			// inlined strings can be inserted directly
			return input_str;
		}
		// if the string is not inlined we need to allocate space for it
		auto input_str_size = UnsafeNumericCast<uint32_t>(input_str.GetSize());
		auto string_memory = aggr_input.allocator.Allocate(input_str_size);
		// copy over the string
		memcpy(string_memory, input_str.GetData(), input_str_size);
		// now insert it into the histogram
		string_t histogram_str(char_ptr_cast(string_memory), input_str_size);
		return histogram_str;
	}